

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

cmListFileContext * __thiscall cmListFileBacktrace::Top(cmListFileBacktrace *this)

{
  int iVar1;
  cmListFileContext *pcVar2;
  
  pcVar2 = &this->Cur->super_cmListFileContext;
  if (((Entry *)pcVar2 == (Entry *)0x0) && (pcVar2 = &Top::empty, Top()::empty == '\0')) {
    iVar1 = __cxa_guard_acquire(&Top()::empty);
    if (iVar1 != 0) {
      Top::empty.Name._M_dataplus._M_p = (pointer)&Top::empty.Name.field_2;
      Top::empty.Name._M_string_length = 0;
      pcVar2 = &Top::empty;
      Top::empty.Name.field_2._M_local_buf[0] = '\0';
      Top::empty.FilePath._M_dataplus._M_p = (pointer)&Top::empty.FilePath.field_2;
      Top::empty.FilePath._M_string_length = 0;
      Top::empty.FilePath.field_2._M_local_buf[0] = '\0';
      Top::empty.Line = 0;
      __cxa_atexit(cmListFileContext::~cmListFileContext,&Top::empty,&__dso_handle);
      __cxa_guard_release(&Top()::empty);
    }
  }
  return &((Entry *)pcVar2)->super_cmListFileContext;
}

Assistant:

cmListFileContext const& cmListFileBacktrace::Top() const
{
  if (this->Cur) {
    return *this->Cur;
  }
  static cmListFileContext const empty;
  return empty;
}